

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

bool __thiscall
RtApiPulse::probeDeviceOpen
          (RtApiPulse *this,uint deviceId,StreamMode mode,uint channels,uint firstChannel,
          uint sampleRate,RtAudioFormat format,uint *bufferSize,StreamOptions *options)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  size_type sVar8;
  reference pvVar9;
  ulong uVar10;
  char *pcVar11;
  PulseAudioHandle *this_00;
  undefined8 uVar12;
  long lVar13;
  bool bVar14;
  uint local_160;
  int local_144;
  int i;
  int result;
  int max;
  int min;
  int priority;
  sched_param param;
  pthread_attr_t attr;
  pa_buffer_attr *attr_ptr;
  undefined4 local_e0;
  undefined4 local_dc;
  uint32_t local_d8;
  undefined1 local_d4 [4];
  PulseAudioHandle *pPStack_d0;
  int error;
  PulseAudioHandle *pah_1;
  unsigned_long bytesOut;
  bool makeBuffer;
  allocator local_a9;
  string local_a8 [8];
  string streamName;
  rtaudio_pa_format_mapping_t *local_88;
  rtaudio_pa_format_mapping_t *sf;
  uint *puStack_78;
  bool sf_found;
  uint *sr;
  undefined8 uStack_68;
  bool sr_found;
  char *dev_output;
  char *dev_input;
  uint local_50;
  uint m;
  int deviceIdx;
  pa_sample_spec ss;
  unsigned_long bufferBytes;
  PulseAudioHandle *pah;
  uint sampleRate_local;
  uint firstChannel_local;
  uint channels_local;
  StreamMode mode_local;
  uint deviceId_local;
  RtApiPulse *this_local;
  
  bufferBytes = 0;
  ss.rate = 0;
  ss.channels = '\0';
  ss._9_3_ = 0;
  local_50 = 0xffffffff;
  for (dev_input._4_4_ = 0;
      sVar8 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                        (&(this->super_RtApi).deviceList_), dev_input._4_4_ < sVar8;
      dev_input._4_4_ = dev_input._4_4_ + 1) {
    pvVar9 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                       (&(this->super_RtApi).deviceList_,(ulong)dev_input._4_4_);
    if (pvVar9->ID == deviceId) {
      local_50 = dev_input._4_4_;
      break;
    }
  }
  if ((int)local_50 < 0) {
    return false;
  }
  if (firstChannel != 0) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_RtApi).errorText_,
               "PulseAudio does not support channel offset mapping.");
    return false;
  }
  dev_output = (char *)0x0;
  uStack_68 = 0;
  std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::operator[]
            (&this->paDeviceList_,(long)(int)local_50);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::operator[]
              (&this->paDeviceList_,(long)(int)local_50);
    dev_output = (char *)std::__cxx11::string::c_str();
  }
  std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::operator[]
            (&this->paDeviceList_,(long)(int)local_50);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::operator[]
              (&this->paDeviceList_,(long)(int)local_50);
    uStack_68 = std::__cxx11::string::c_str();
  }
  if ((mode == INPUT) &&
     (pvVar9 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                         (&(this->super_RtApi).deviceList_,(long)(int)local_50),
     pvVar9->inputChannels < channels)) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_RtApi).errorText_,
               "PulseAudio device does not support requested input channel count.");
    return false;
  }
  if ((mode == OUTPUT) &&
     (pvVar9 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                         (&(this->super_RtApi).deviceList_,(long)(int)local_50),
     pvVar9->outputChannels < channels)) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_RtApi).errorText_,
               "PulseAudio device does not support requested output channel count.");
    return false;
  }
  ss.format._0_1_ = (undefined1)channels;
  bVar2 = false;
  for (puStack_78 = SUPPORTED_SAMPLERATES; *puStack_78 != 0; puStack_78 = puStack_78 + 1) {
    if (sampleRate == *puStack_78) {
      bVar2 = true;
      (this->super_RtApi).stream_.sampleRate = sampleRate;
      deviceIdx = sampleRate;
      break;
    }
  }
  if (!bVar2) {
    (this->super_RtApi).stream_.sampleRate = sampleRate;
    deviceIdx = sampleRate;
  }
  bVar2 = false;
  local_88 = supported_sampleformats;
  while( true ) {
    bVar14 = false;
    if (local_88->rtaudio_format != 0) {
      bVar14 = local_88->pa_format != PA_SAMPLE_INVALID;
    }
    if (!bVar14) goto LAB_00127548;
    if (format == local_88->rtaudio_format) break;
    local_88 = local_88 + 1;
  }
  bVar2 = true;
  (this->super_RtApi).stream_.userFormat = local_88->rtaudio_format;
  (this->super_RtApi).stream_.deviceFormat[mode] = (this->super_RtApi).stream_.userFormat;
  m = local_88->pa_format;
LAB_00127548:
  if (!bVar2) {
    (this->super_RtApi).stream_.userFormat = format;
    (this->super_RtApi).stream_.deviceFormat[mode] = 0x10;
    m = 5;
  }
  if ((options == (StreamOptions *)0x0) || ((options->flags & 1) == 0)) {
    (this->super_RtApi).stream_.userInterleaved = true;
  }
  else {
    (this->super_RtApi).stream_.userInterleaved = false;
  }
  (this->super_RtApi).stream_.deviceInterleaved[mode] = true;
  if (options == (StreamOptions *)0x0) {
    local_160 = 1;
  }
  else {
    local_160 = options->numberOfBuffers;
  }
  (this->super_RtApi).stream_.nBuffers = local_160;
  (this->super_RtApi).stream_.doByteSwap[mode] = false;
  (this->super_RtApi).stream_.nUserChannels[mode] = channels;
  (this->super_RtApi).stream_.nDeviceChannels[mode] = channels;
  (this->super_RtApi).stream_.channelOffset[mode] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"RtAudio",&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  (this->super_RtApi).stream_.doConvertBuffer[mode] = false;
  if ((this->super_RtApi).stream_.userFormat != (this->super_RtApi).stream_.deviceFormat[mode]) {
    (this->super_RtApi).stream_.doConvertBuffer[mode] = true;
  }
  if ((this->super_RtApi).stream_.nUserChannels[mode] <
      (this->super_RtApi).stream_.nDeviceChannels[mode]) {
    (this->super_RtApi).stream_.doConvertBuffer[mode] = true;
  }
  if (((this->super_RtApi).stream_.userInterleaved & 1U) !=
      ((this->super_RtApi).stream_.deviceInterleaved[mode] & 1U)) {
    (this->super_RtApi).stream_.doConvertBuffer[mode] = true;
  }
  uVar1 = (this->super_RtApi).stream_.nUserChannels[mode];
  uVar4 = *bufferSize;
  uVar3 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.userFormat);
  ss._4_8_ = ZEXT48(uVar1 * uVar4 * uVar3);
  pcVar11 = (char *)calloc(ss._4_8_,1);
  (this->super_RtApi).stream_.userBuffer[mode] = pcVar11;
  if ((this->super_RtApi).stream_.userBuffer[mode] == (char *)0x0) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_RtApi).errorText_,
               "RtApiPulse::probeDeviceOpen: error allocating user buffer memory.");
  }
  else {
    (this->super_RtApi).stream_.bufferSize = *bufferSize;
    if (((this->super_RtApi).stream_.doConvertBuffer[mode] & 1U) != 0) {
      bytesOut._3_1_ = 1;
      uVar1 = (this->super_RtApi).stream_.nDeviceChannels[mode];
      uVar4 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.deviceFormat[mode]);
      ss._4_8_ = ZEXT48(uVar1 * uVar4);
      if (((mode == INPUT) && ((this->super_RtApi).stream_.mode == OUTPUT)) &&
         ((this->super_RtApi).stream_.deviceBuffer != (char *)0x0)) {
        uVar1 = (this->super_RtApi).stream_.nDeviceChannels[0];
        uVar4 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.deviceFormat[0]);
        pah_1 = (PulseAudioHandle *)(ulong)(uVar1 * uVar4);
        if ((ulong)ss._4_8_ <= pah_1) {
          bytesOut._3_1_ = 0;
        }
      }
      if ((bytesOut._3_1_ & 1) != 0) {
        ss._4_8_ = (ulong)*bufferSize * ss._4_8_;
        if ((this->super_RtApi).stream_.deviceBuffer != (char *)0x0) {
          free((this->super_RtApi).stream_.deviceBuffer);
        }
        pcVar11 = (char *)calloc(ss._4_8_,1);
        (this->super_RtApi).stream_.deviceBuffer = pcVar11;
        if ((this->super_RtApi).stream_.deviceBuffer == (char *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)&(this->super_RtApi).errorText_,
                     "RtApiPulse::probeDeviceOpen: error allocating device buffer memory.");
          goto LAB_00127f2d;
        }
      }
    }
    (this->super_RtApi).stream_.deviceId[mode] = local_50;
    if (((this->super_RtApi).stream_.doConvertBuffer[mode] & 1U) != 0) {
      RtApi::setConvertInfo(&this->super_RtApi,mode,0);
    }
    if ((this->super_RtApi).stream_.apiHandle == (void *)0x0) {
      this_00 = (PulseAudioHandle *)operator_new(0x50);
      PulseAudioHandle::PulseAudioHandle(this_00);
      pPStack_d0 = this_00;
      if (this_00 == (PulseAudioHandle *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: error allocating memory for handle.");
      }
      else {
        (this->super_RtApi).stream_.apiHandle = this_00;
        iVar5 = pthread_cond_init((pthread_cond_t *)&this_00->runnable_cv,(pthread_condattr_t *)0x0)
        ;
        if (iVar5 == 0) goto LAB_00127a7d;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: error creating condition variable.");
      }
    }
    else {
LAB_00127a7d:
      bufferBytes = (unsigned_long)(this->super_RtApi).stream_.apiHandle;
      if ((options != (StreamOptions *)0x0) &&
         (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
        std::__cxx11::string::operator=(local_a8,(string *)&options->streamName);
      }
      uVar6 = ss.rate;
      if (mode == OUTPUT) {
        if ((options == (StreamOptions *)0x0) || (options->numberOfBuffers == 0)) {
          attr._48_8_ = 0;
        }
        else {
          attr_ptr._0_4_ = uVar6 * options->numberOfBuffers;
          local_dc = 0xffffffff;
          local_e0 = 0xffffffff;
          attr_ptr._4_4_ = 0xffffffff;
          attr._48_8_ = &attr_ptr;
        }
        uVar12 = std::__cxx11::string::c_str();
        lVar13 = pa_simple_new(0,uVar12,1,uStack_68,"Playback",&m,0,attr._48_8_,local_d4);
        *(long *)bufferBytes = lVar13;
        if (*(long *)bufferBytes != 0) {
LAB_00127ce2:
          if ((this->super_RtApi).stream_.mode == UNINITIALIZED) {
            (this->super_RtApi).stream_.mode = mode;
          }
          else {
            if ((this->super_RtApi).stream_.mode == mode) goto LAB_00127f2d;
            (this->super_RtApi).stream_.mode = DUPLEX;
          }
          if (((this->super_RtApi).stream_.callbackInfo.isRunning & 1U) == 0) {
            (this->super_RtApi).stream_.callbackInfo.object = this;
            (this->super_RtApi).stream_.state = STREAM_STOPPED;
            pthread_attr_init((pthread_attr_t *)&priority);
            pthread_attr_setdetachstate((pthread_attr_t *)&priority,0);
            if ((options == (StreamOptions *)0x0) || ((options->flags & 8) == 0)) {
              pthread_attr_setschedpolicy((pthread_attr_t *)&priority,0);
            }
            else {
              (this->super_RtApi).stream_.callbackInfo.doRealtime = true;
              iVar5 = options->priority;
              max = sched_get_priority_min(2);
              iVar7 = sched_get_priority_max(2);
              if ((max <= iVar5) && (max = iVar5, iVar7 < iVar5)) {
                max = iVar7;
              }
              min = max;
              pthread_attr_setschedpolicy((pthread_attr_t *)&priority,2);
              pthread_attr_setscope((pthread_attr_t *)&priority,0);
              pthread_attr_setinheritsched((pthread_attr_t *)&priority,1);
              pthread_attr_setschedparam((pthread_attr_t *)&priority,(sched_param *)&min);
            }
            (this->super_RtApi).stream_.callbackInfo.isRunning = true;
            iVar5 = pthread_create((pthread_t *)(bufferBytes + 0x10),(pthread_attr_t *)&priority,
                                   pulseaudio_callback,&(this->super_RtApi).stream_.callbackInfo);
            pthread_attr_destroy((pthread_attr_t *)&priority);
            if ((iVar5 != 0) &&
               (iVar5 = pthread_create((pthread_t *)(bufferBytes + 0x10),(pthread_attr_t *)0x0,
                                       pulseaudio_callback,&(this->super_RtApi).stream_.callbackInfo
                                      ), iVar5 != 0)) {
              (this->super_RtApi).stream_.callbackInfo.isRunning = false;
              std::__cxx11::string::operator=
                        ((string *)&(this->super_RtApi).errorText_,
                         "RtApiPulse::probeDeviceOpen: error creating thread.");
              goto LAB_00127f2d;
            }
          }
          this_local._7_1_ = true;
          goto LAB_00128049;
        }
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: error connecting output to PulseAudio server.");
      }
      else if (mode == INPUT) {
        if ((options == (StreamOptions *)0x0) || (options->numberOfBuffers == 0)) {
          attr_ptr._0_4_ = (int)(ss._4_8_ << 2);
        }
        else {
          attr_ptr._0_4_ = uVar6 * (options->numberOfBuffers + 1);
        }
        local_d8 = uVar6;
        uVar12 = std::__cxx11::string::c_str();
        lVar13 = pa_simple_new(0,uVar12,2,dev_output,"Record",&m,0,&attr_ptr,local_d4);
        *(long *)(bufferBytes + 8) = lVar13;
        if (*(long *)(bufferBytes + 8) != 0) goto LAB_00127ce2;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: error connecting input to PulseAudio server.");
      }
      else if (mode == DUPLEX) {
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,
                   "RtApiPulse::probeDeviceOpen: duplex not supported for PulseAudio.");
      }
    }
  }
LAB_00127f2d:
  if ((bufferBytes != 0) && (((this->super_RtApi).stream_.callbackInfo.isRunning & 1U) != 0)) {
    pthread_cond_destroy((pthread_cond_t *)(bufferBytes + 0x18));
    if (bufferBytes != 0) {
      operator_delete((void *)bufferBytes);
    }
    (this->super_RtApi).stream_.apiHandle = (void *)0x0;
  }
  for (local_144 = 0; local_144 < 2; local_144 = local_144 + 1) {
    if ((this->super_RtApi).stream_.userBuffer[local_144] != (char *)0x0) {
      free((this->super_RtApi).stream_.userBuffer[local_144]);
      (this->super_RtApi).stream_.userBuffer[local_144] = (char *)0x0;
    }
  }
  if ((this->super_RtApi).stream_.deviceBuffer != (char *)0x0) {
    free((this->super_RtApi).stream_.deviceBuffer);
    (this->super_RtApi).stream_.deviceBuffer = (char *)0x0;
  }
  (this->super_RtApi).stream_.state = STREAM_CLOSED;
  this_local._7_1_ = false;
LAB_00128049:
  std::__cxx11::string::~string(local_a8);
  return this_local._7_1_;
}

Assistant:

bool RtApiPulse::probeDeviceOpen( unsigned int deviceId, StreamMode mode,
                                  unsigned int channels, unsigned int firstChannel,
                                  unsigned int sampleRate, RtAudioFormat format,
                                  unsigned int *bufferSize, RtAudio::StreamOptions *options )
{
  PulseAudioHandle *pah = 0;
  unsigned long bufferBytes = 0;
  pa_sample_spec ss;

  int deviceIdx = -1;
  for ( unsigned int m=0; m<deviceList_.size(); m++ ) {
    if ( deviceList_[m].ID == deviceId ) {
      deviceIdx = m;
      break;
    }
  }

  if ( deviceIdx < 0 ) return false;

  if ( firstChannel != 0 ) {
    errorText_ = "PulseAudio does not support channel offset mapping.";
    return false;
  }

  // These may be NULL for default devices but we already have the names.
  const char *dev_input = NULL;
  const char *dev_output = NULL;
  if ( !paDeviceList_[deviceIdx].sourceName.empty() )
    dev_input = paDeviceList_[deviceIdx].sourceName.c_str();
  if ( !paDeviceList_[deviceIdx].sinkName.empty() )
    dev_output = paDeviceList_[deviceIdx].sinkName.c_str();

  if ( mode==INPUT && deviceList_[deviceIdx].inputChannels < channels ) {
    errorText_ = "PulseAudio device does not support requested input channel count.";
    return false;
  }
  if ( mode==OUTPUT && deviceList_[deviceIdx].outputChannels < channels ) {
    errorText_ = "PulseAudio device does not support requested output channel count.";
    return false;
  }

  ss.channels = channels;

  bool sr_found = false;
  for ( const unsigned int *sr = SUPPORTED_SAMPLERATES; *sr; ++sr ) {
    if ( sampleRate == *sr ) {
      sr_found = true;
      stream_.sampleRate = sampleRate;
      ss.rate = sampleRate;
      break;
    }
  }
  if ( !sr_found ) {
    stream_.sampleRate = sampleRate;
    ss.rate = sampleRate;
  }

  bool sf_found = 0;
  for ( const rtaudio_pa_format_mapping_t *sf = supported_sampleformats;
        sf->rtaudio_format && sf->pa_format != PA_SAMPLE_INVALID; ++sf ) {
    if ( format == sf->rtaudio_format ) {
      sf_found = true;
      stream_.userFormat = sf->rtaudio_format;
      stream_.deviceFormat[mode] = stream_.userFormat;
      ss.format = sf->pa_format;
      break;
    }
  }
  if ( !sf_found ) { // Use internal data format conversion.
    stream_.userFormat = format;
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT32;
    ss.format = PA_SAMPLE_FLOAT32LE;
  }

  // Set other stream parameters.
  if ( options && options->flags & RTAUDIO_NONINTERLEAVED ) stream_.userInterleaved = false;
  else stream_.userInterleaved = true;
  stream_.deviceInterleaved[mode] = true;
  stream_.nBuffers = options ? options->numberOfBuffers : 1;
  stream_.doByteSwap[mode] = false;
  stream_.nUserChannels[mode] = channels;
  stream_.nDeviceChannels[mode] = channels + firstChannel;
  stream_.channelOffset[mode] = 0;
  std::string streamName = "RtAudio";

  // Set flags for buffer conversion.
  stream_.doConvertBuffer[mode] = false;
  if ( stream_.userFormat != stream_.deviceFormat[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.nUserChannels[mode] < stream_.nDeviceChannels[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.userInterleaved != stream_.deviceInterleaved[mode] )
    stream_.doConvertBuffer[mode] = true;

  // Allocate necessary internal buffers.
  bufferBytes = stream_.nUserChannels[mode] * *bufferSize * formatBytes( stream_.userFormat );
  stream_.userBuffer[mode] = (char *) calloc( bufferBytes, 1 );
  if ( stream_.userBuffer[mode] == NULL ) {
    errorText_ = "RtApiPulse::probeDeviceOpen: error allocating user buffer memory.";
    goto error;
  }
  stream_.bufferSize = *bufferSize;

  if ( stream_.doConvertBuffer[mode] ) {

    bool makeBuffer = true;
    bufferBytes = stream_.nDeviceChannels[mode] * formatBytes( stream_.deviceFormat[mode] );
    if ( mode == INPUT ) {
      if ( stream_.mode == OUTPUT && stream_.deviceBuffer ) {
        unsigned long bytesOut = stream_.nDeviceChannels[0] * formatBytes( stream_.deviceFormat[0] );
        if ( bufferBytes <= bytesOut ) makeBuffer = false;
      }
    }

    if ( makeBuffer ) {
      bufferBytes *= *bufferSize;
      if ( stream_.deviceBuffer ) free( stream_.deviceBuffer );
      stream_.deviceBuffer = (char *) calloc( bufferBytes, 1 );
      if ( stream_.deviceBuffer == NULL ) {
        errorText_ = "RtApiPulse::probeDeviceOpen: error allocating device buffer memory.";
        goto error;
      }
    }
  }

  stream_.deviceId[mode] = deviceIdx;

  // Setup the buffer conversion information structure.
  if ( stream_.doConvertBuffer[mode] ) setConvertInfo( mode, firstChannel );

  if ( !stream_.apiHandle ) {
    PulseAudioHandle *pah = new PulseAudioHandle;
    if ( !pah ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error allocating memory for handle.";
      goto error;
    }

    stream_.apiHandle = pah;
    if ( pthread_cond_init( &pah->runnable_cv, NULL ) != 0 ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error creating condition variable.";
      goto error;
    }
  }
  pah = static_cast<PulseAudioHandle *>( stream_.apiHandle );

  int error;
  if ( options && !options->streamName.empty() ) streamName = options->streamName;
  switch ( mode ) {
    pa_buffer_attr buffer_attr;
  case INPUT:
    buffer_attr.fragsize = bufferBytes;
    if ( options && options->numberOfBuffers > 0 )
      buffer_attr.maxlength = bufferBytes * (options->numberOfBuffers + 1);
    else
      buffer_attr.maxlength = bufferBytes * 4;

    pah->s_rec = pa_simple_new( NULL, streamName.c_str(), PA_STREAM_RECORD,
                                dev_input, "Record", &ss, NULL, &buffer_attr, &error );
    if ( !pah->s_rec ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error connecting input to PulseAudio server.";
      goto error;
    }
    break;
  case OUTPUT: {
    pa_buffer_attr * attr_ptr;

    if ( options && options->numberOfBuffers > 0 ) {
      // pa_buffer_attr::fragsize is recording-only.
      // Hopefully PortAudio won't access uninitialized fields.
      buffer_attr.maxlength = bufferBytes * options->numberOfBuffers;
      buffer_attr.minreq = -1;
      buffer_attr.prebuf = -1;
      buffer_attr.tlength = -1;
      attr_ptr = &buffer_attr;
    } else {
      attr_ptr = nullptr;
    }

    pah->s_play = pa_simple_new( NULL, streamName.c_str(), PA_STREAM_PLAYBACK,
                                 dev_output, "Playback", &ss, NULL, attr_ptr, &error );
    if ( !pah->s_play ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error connecting output to PulseAudio server.";
      goto error;
    }
    break;
  }
  case DUPLEX:
    /* Note: We could add DUPLEX by synchronizing multiple streams,
       but it would mean moving from Simple API to Asynchronous API:
       https://freedesktop.org/software/pulseaudio/doxygen/streams.html#sync_streams */
    errorText_ = "RtApiPulse::probeDeviceOpen: duplex not supported for PulseAudio.";
    goto error;
  default:
    goto error;
  }

  if ( stream_.mode == UNINITIALIZED )
    stream_.mode = mode;
  else if ( stream_.mode == mode )
    goto error;
  else
    stream_.mode = DUPLEX;

  if ( !stream_.callbackInfo.isRunning ) {
    stream_.callbackInfo.object = this;
    
    stream_.state = STREAM_STOPPED;
    // Set the thread attributes for joinable and realtime scheduling
    // priority (optional).  The higher priority will only take affect
    // if the program is run as root or suid. Note, under Linux
    // processes with CAP_SYS_NICE privilege, a user can change
    // scheduling policy and priority (thus need not be root). See
    // POSIX "capabilities".
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
    if ( options && options->flags & RTAUDIO_SCHEDULE_REALTIME ) {
      stream_.callbackInfo.doRealtime = true;
      struct sched_param param;
      int priority = options->priority;
      int min = sched_get_priority_min( SCHED_RR );
      int max = sched_get_priority_max( SCHED_RR );
      if ( priority < min ) priority = min;
      else if ( priority > max ) priority = max;
      param.sched_priority = priority;
      
      // Set the policy BEFORE the priority. Otherwise it fails.
      pthread_attr_setschedpolicy(&attr, SCHED_RR);
      pthread_attr_setscope (&attr, PTHREAD_SCOPE_SYSTEM);
      // This is definitely required. Otherwise it fails.
      pthread_attr_setinheritsched(&attr, PTHREAD_EXPLICIT_SCHED);
      pthread_attr_setschedparam(&attr, &param);
    }
    else
      pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#else
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#endif

    stream_.callbackInfo.isRunning = true;
    int result = pthread_create( &pah->thread, &attr, pulseaudio_callback, (void *)&stream_.callbackInfo);
    pthread_attr_destroy(&attr);
    if(result != 0) {
      // Failed. Try instead with default attributes.
      result = pthread_create( &pah->thread, NULL, pulseaudio_callback, (void *)&stream_.callbackInfo);
      if(result != 0) {
        stream_.callbackInfo.isRunning = false;
        errorText_ = "RtApiPulse::probeDeviceOpen: error creating thread.";
        goto error;
      }
    }
  }

  return SUCCESS;
 
 error:
  if ( pah && stream_.callbackInfo.isRunning ) {
    pthread_cond_destroy( &pah->runnable_cv );
    delete pah;
    stream_.apiHandle = 0;
  }

  for ( int i=0; i<2; i++ ) {
    if ( stream_.userBuffer[i] ) {
      free( stream_.userBuffer[i] );
      stream_.userBuffer[i] = 0;
    }
  }

  if ( stream_.deviceBuffer ) {
    free( stream_.deviceBuffer );
    stream_.deviceBuffer = 0;
  }

  stream_.state = STREAM_CLOSED;
  return FAILURE;
}